

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O0

void __thiscall
uttamarin::App::PrintFooter
          (App *this,int true_lemmas,int false_lemmas,int unknown_lemmas,int overall_duration)

{
  element_type *peVar1;
  OutputWriter *pOVar2;
  int duration;
  string local_40;
  uint local_20;
  int local_1c;
  int overall_duration_local;
  int unknown_lemmas_local;
  int false_lemmas_local;
  int true_lemmas_local;
  App *this_local;
  
  local_20 = overall_duration;
  local_1c = unknown_lemmas;
  overall_duration_local = false_lemmas;
  unknown_lemmas_local = true_lemmas;
  _false_lemmas_local = this;
  peVar1 = std::
           __shared_ptr_access<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->output_writer_);
  pOVar2 = OutputWriter::operator<<(peVar1,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"Summary: ");
  pOVar2 = OutputWriter::operator<<(pOVar2,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"verified: ");
  pOVar2 = OutputWriter::operator<<(pOVar2,unknown_lemmas_local);
  pOVar2 = OutputWriter::operator<<(pOVar2,", false: ");
  pOVar2 = OutputWriter::operator<<(pOVar2,overall_duration_local);
  pOVar2 = OutputWriter::operator<<(pOVar2,", timeout: ");
  pOVar2 = OutputWriter::operator<<(pOVar2,local_1c);
  pOVar2 = OutputWriter::operator<<(pOVar2,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"Overall duration: ");
  ToSecondsString_abi_cxx11_(&local_40,(uttamarin *)(ulong)local_20,duration);
  OutputWriter::operator<<(pOVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  peVar1 = std::
           __shared_ptr_access<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->output_writer_);
  OutputWriter::Endl(peVar1);
  return;
}

Assistant:

void App::PrintFooter(int true_lemmas, int false_lemmas,
                      int unknown_lemmas, int overall_duration) {
  *output_writer_ << "\n"
    << "Summary: " << "\n"
    << "verified: " << true_lemmas
    << ", false: " << false_lemmas
    << ", timeout: " << unknown_lemmas
    << "\n"
    << "Overall duration: " << ToSecondsString(overall_duration);
  output_writer_->Endl();
}